

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void obj_from_obj(OBJ_DATA *obj)

{
  string_view fmt;
  string_view fmt_00;
  int iVar1;
  size_t in_RDI;
  char *unaff_retaddr;
  OBJ_DATA *prev;
  OBJ_DATA *obj_from;
  OBJ_DATA *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  long lVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  CLogger *this;
  
  this = *(CLogger **)(in_RDI + 0x18);
  if (this == (CLogger *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    fmt._M_str = unaff_retaddr;
    fmt._M_len = in_RDI;
    CLogger::Debug<>(this,fmt);
  }
  else {
    if (in_RDI == *(size_t *)(this + 0x10)) {
      *(undefined8 *)(this + 0x10) = *(undefined8 *)(in_RDI + 8);
    }
    else {
      for (lVar2 = *(long *)(this + 0x10); lVar2 != 0; lVar2 = *(long *)(lVar2 + 8)) {
        if (*(size_t *)(lVar2 + 8) == in_RDI) {
          *(undefined8 *)(lVar2 + 8) = *(undefined8 *)(in_RDI + 8);
          break;
        }
      }
      if (lVar2 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffe0,(char *)0x0);
        fmt_00._M_str = unaff_retaddr;
        fmt_00._M_len = in_RDI;
        CLogger::Warn<>(this,fmt_00);
        return;
      }
    }
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x18) = 0;
    for (; this != (CLogger *)0x0; this = *(CLogger **)(this + 0x18)) {
      if (*(long *)(this + 0x28) != 0) {
        iVar1 = get_obj_weight(in_stack_ffffffffffffffd0);
        *(short *)(*(long *)(this + 0x28) + 0x1fe) =
             *(short *)(*(long *)(this + 0x28) + 0x1fe) - (short)iVar1;
      }
    }
  }
  return;
}

Assistant:

void obj_from_obj(OBJ_DATA *obj)
{
	OBJ_DATA *obj_from;

	if ((obj_from = obj->in_obj) == nullptr)
	{
		RS.Logger.Debug("Obj_from_obj: null obj_from.");
		return;
	}

	if (obj == obj_from->contains)
	{
		obj_from->contains = obj->next_content;
	}
	else
	{
		OBJ_DATA *prev;

		for (prev = obj_from->contains; prev; prev = prev->next_content)
		{
			if (prev->next_content == obj)
			{
				prev->next_content = obj->next_content;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Obj_from_obj: obj not found.");
			return;
		}
	}

	obj->next_content = nullptr;
	obj->in_obj = nullptr;

	for (; obj_from != nullptr; obj_from = obj_from->in_obj)
	{
		if (obj_from->carried_by != nullptr)
		{
			obj_from->carried_by->carry_weight -= get_obj_weight(obj);
		}
	}
}